

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O2

void la_daxpy_ie(int n,double alpha,double *x,int incx,double *y,int incy)

{
  uint uVar1;
  char *__assertion;
  ulong uVar2;
  bool bVar3;
  
  if (x == (double *)0x0) {
    __assertion = "x";
    uVar1 = 0x5f;
  }
  else if (y == (double *)0x0) {
    __assertion = "y";
    uVar1 = 0x60;
  }
  else {
    if (x != y) {
      uVar1 = 0;
      if (0 < n) {
        uVar1 = n;
      }
      uVar2 = (ulong)uVar1;
      while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
        *y = *x * alpha + *y;
        x = x + incx;
        y = y + incy;
      }
      return;
    }
    __assertion = "x != y";
    uVar1 = 0x61;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,uVar1,"void la_daxpy_ie(int, double, const double *, int, double *, int)");
}

Assistant:

void la_daxpy_ie(
        int n,
        double alpha,
        const double *x, int incx,
        double *y, int incy)
{
    assert(x);
    assert(y);
    assert(x != y);

    for (int i = 0; i < n; i++) {
        y[i * incy] = alpha * x[i * incx] + y[i * incy];
    }
}